

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O2

int kvtree_sort(kvtree *hash,int direction)

{
  kvtree_elem_struct *pkVar1;
  kvtree_elem_struct **ppkVar2;
  int iVar3;
  sort_elem_str *__base;
  kvtree_elem_struct *pkVar4;
  kvtree_elem **ppkVar5;
  anon_struct_16_2_6a822a49_for_pointers *paVar6;
  code *__compar;
  long lVar7;
  sort_elem_str *list;
  
  iVar3 = kvtree_size(hash);
  __base = (sort_elem_str *)
           kvtree_malloc((long)iVar3 << 4,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree.c"
                         ,0x23e);
  lVar7 = 0;
  pkVar4 = (kvtree_elem_struct *)0x0;
  paVar6 = (anon_struct_16_2_6a822a49_for_pointers *)hash;
  if (hash == (kvtree *)0x0) goto LAB_0010423e;
  while( true ) {
    pkVar4 = paVar6->le_next;
LAB_0010423e:
    if (pkVar4 == (kvtree_elem_struct *)0x0) break;
    __base[lVar7].key = pkVar4->key;
    __base[lVar7].addr = pkVar4;
    lVar7 = lVar7 + 1;
    paVar6 = &pkVar4->pointers;
  }
  __compar = kvtree_cmp_fn_str_asc;
  if (direction == 1) {
    __compar = kvtree_cmp_fn_str_desc;
  }
  list = __base;
  qsort(__base,(long)iVar3,0x10,__compar);
  ppkVar5 = &__base[lVar7 + -1].addr;
  for (; 0 < lVar7; lVar7 = lVar7 + -1) {
    pkVar4 = *ppkVar5;
    pkVar1 = (pkVar4->pointers).le_next;
    ppkVar2 = (pkVar4->pointers).le_prev;
    if (pkVar1 != (kvtree_elem_struct *)0x0) {
      (pkVar1->pointers).le_prev = ppkVar2;
    }
    *ppkVar2 = pkVar1;
    pkVar1 = hash->lh_first;
    (pkVar4->pointers).le_next = pkVar1;
    if (pkVar1 != (kvtree_elem_struct *)0x0) {
      (pkVar1->pointers).le_prev = &(pkVar4->pointers).le_next;
    }
    hash->lh_first = pkVar4;
    (pkVar4->pointers).le_prev = &hash->lh_first;
    ppkVar5 = ppkVar5 + -2;
  }
  kvtree_free(&list);
  return 0;
}

Assistant:

int kvtree_sort(kvtree* hash, int direction)
{
  /* get the size of the hash */
  int count = kvtree_size(hash);

  /* allocate space for each element */
  struct sort_elem_str* list = (struct sort_elem_str*) KVTREE_MALLOC(count * sizeof(struct sort_elem_str));

  /* walk the hash and fill in the keys */
  kvtree_elem* elem = NULL;
  int index = 0;
  for (elem = kvtree_elem_first(hash);
       elem != NULL;
       elem = kvtree_elem_next(elem))
  {
    char* key = kvtree_elem_key(elem);
    list[index].key = key;
    list[index].addr = elem;
    index++;
  }

  /* sort the elements by key */
  int (*fn)(const void* a, const void* b) = NULL;
  fn = &kvtree_cmp_fn_str_asc;
  if (direction == KVTREE_SORT_DESCENDING) {
    fn = &kvtree_cmp_fn_str_desc;
  }
  qsort(list, count, sizeof(struct sort_elem_str), fn);

  /* walk the sorted list backwards, extracting the element by address,
   * and inserting at the head */
  while (index > 0) {
    index--;
    elem = list[index].addr;
    LIST_REMOVE(elem, pointers);
    LIST_INSERT_HEAD(hash, elem, pointers);
  }

  /* free the list */
  kvtree_free(&list);

  return KVTREE_SUCCESS;
}